

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  DataLisp lisp;
  SourceLogger logger;
  string local_48;
  string content;
  
  if (argc == 2) {
    content._M_dataplus._M_p = (pointer)&content.field_2;
    content._M_string_length = 0;
    content.field_2._M_local_buf[0] = '\0';
    get_file_contents_abi_cxx11_(&local_48,argv[1]);
    std::__cxx11::string::operator=((string *)&content,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DL::SourceLogger::SourceLogger(&logger);
    DL::DataLisp::DataLisp(&lisp,&logger,true);
    DL::DataLisp::parse((string *)&lisp);
    DL::DataLisp::dump_abi_cxx11_();
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_48);
    DL::DataLisp::~DataLisp(&lisp);
    DL::SourceLogger::~SourceLogger(&logger);
    iVar2 = 0;
    std::__cxx11::string::~string((string *)&content);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Use \'dl_dump [INPUT]\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc != 2)
	{
		std::cout << "Use 'dl_dump [INPUT]'" << std::endl;
		return -1;
	}

	std::string content;
	try
	{
		content = get_file_contents(argv[1]);
	}
	catch (...)
	{
		std::cout << "Couldn't read file '" << argv[1] << "'" << std::endl;
		return -2;
	}

	DL::SourceLogger logger;
	DL::DataLisp lisp(&logger);

	lisp.parse(content);
	std::cout << lisp.dump() << std::endl;

	return 0;
}